

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O3

void __thiscall QTabBarPrivate::setupMovableTab(QTabBarPrivate *this)

{
  QWidget *pQVar1;
  Tab *pTVar2;
  bool bVar3;
  undefined1 auVar4 [12];
  int iVar5;
  QMovableTabWidget *pQVar6;
  QStyle *pQVar7;
  Representation RVar8;
  int iVar9;
  Representation RVar10;
  QRect *r;
  int iVar11;
  long in_FS_OFFSET;
  double dVar12;
  double dVar13;
  QRect QVar14;
  QStyleOptionTab tab;
  undefined1 *local_128;
  QWidget *pQStack_120;
  QStyle *local_118;
  undefined1 local_108 [16];
  undefined1 *local_f8;
  undefined1 local_e8 [8];
  int local_e0;
  Representation RStack_dc;
  QStyleOptionTab local_d8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  if (this->movingTab == (QMovableTabWidget *)0x0) {
    pQVar6 = (QMovableTabWidget *)operator_new(0x40);
    QWidget::QWidget((QWidget *)pQVar6,pQVar1,(WindowFlags)0x0);
    *(undefined ***)&pQVar6->super_QWidget = &PTR_metaObject_007fbab8;
    *(undefined ***)&(pQVar6->super_QWidget).super_QPaintDevice = &PTR__QMovableTabWidget_007fbc68;
    QPixmap::QPixmap(&pQVar6->m_pixmap);
    this->movingTab = pQVar6;
  }
  pQVar7 = QWidget::style(pQVar1);
  iVar5 = (**(code **)(*(long *)pQVar7 + 0xe0))(pQVar7,0x13,0,pQVar1);
  QVar14 = QTabBar::tabRect((QTabBar *)pQVar1,this->pressedIndex);
  auVar4 = QVar14._0_12_;
  RVar8 = QVar14.y1.m_i;
  RVar10 = QVar14.y2.m_i;
  if ((this->shape - RoundedWest & 0xfffffffa) == 0) {
    RVar8.m_i = RVar8.m_i - iVar5;
    _local_e0 = QVar14._8_8_;
    local_e8._4_4_ = RVar8.m_i;
    local_e8._0_4_ = QVar14.x1.m_i.m_i;
    RVar10.m_i = RVar10.m_i + iVar5;
    RStack_dc.m_i = RVar10.m_i;
  }
  else {
    local_e8._0_4_ = QVar14.x1.m_i.m_i - iVar5;
    auVar4._4_4_ = 0;
    auVar4._0_4_ = local_e8._0_4_;
    stack0xffffffffffffff1c = QVar14._4_12_;
    iVar11 = QVar14.x2.m_i.m_i + iVar5;
    auVar4._8_4_ = iVar11;
    local_e0 = iVar11;
    RStack_dc.m_i = RVar10.m_i;
  }
  local_f8 = &DAT_aaaaaaaaaaaaaaaa;
  local_108._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_108._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  dVar12 = (double)QPaintDevice::devicePixelRatio();
  dVar13 = (double)((auVar4._8_4_ - auVar4._0_4_) + 1) * dVar12;
  dVar13 = (double)((ulong)dVar13 & 0x8000000000000000 | 0x3fe0000000000000) + dVar13;
  bVar3 = 2147483647.0 < dVar13;
  if (dVar13 <= -2147483648.0) {
    dVar13 = -2147483648.0;
  }
  local_d8.super_QStyleOption.version =
       (int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 | ~-(ulong)bVar3 & (ulong)dVar13);
  dVar12 = (double)((RVar10.m_i - RVar8.m_i) + 1) * dVar12;
  dVar12 = (double)((ulong)dVar12 & 0x8000000000000000 | 0x3fe0000000000000) + dVar12;
  bVar3 = 2147483647.0 < dVar12;
  if (dVar12 <= -2147483648.0) {
    dVar12 = -2147483648.0;
  }
  local_d8.super_QStyleOption.type =
       (int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 | ~-(ulong)bVar3 & (ulong)dVar12);
  QPixmap::QPixmap((QPixmap *)local_108,(QSize *)&local_d8);
  dVar12 = (double)QPaintDevice::devicePixelRatio();
  QPixmap::setDevicePixelRatio(dVar12);
  QColor::QColor((QColor *)&local_d8,transparent);
  QPixmap::fill((QColor *)local_108);
  local_118 = (QStyle *)&DAT_aaaaaaaaaaaaaaaa;
  local_128 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_120 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)&local_128);
  pQStack_120 = pQVar1;
  local_118 = QWidget::style(pQVar1);
  QPainter::begin((QPaintDevice *)&local_128);
  QPainter::setRenderHint((RenderHint)(QPainter *)&local_128,true);
  memset(&local_d8,0xaa,0xa0);
  QStyleOptionTab::QStyleOptionTab(&local_d8);
  (**(code **)(*(long *)pQVar1 + 0x1c8))(pQVar1,&local_d8,this->pressedIndex);
  local_d8.position = Moving;
  if ((this->shape - RoundedWest & 0xfffffffa) == 0) {
    iVar9 = -local_d8.super_QStyleOption.rect.x1.m_i;
    local_d8.super_QStyleOption.rect.x1.m_i = 0;
    iVar11 = iVar5 - local_d8.super_QStyleOption.rect.y1.m_i;
    local_d8.super_QStyleOption.rect.y1.m_i = iVar5;
  }
  else {
    iVar9 = iVar5 - local_d8.super_QStyleOption.rect.x1.m_i;
    iVar11 = -local_d8.super_QStyleOption.rect.y1.m_i;
    local_d8.super_QStyleOption.rect.y1.m_i = 0;
    local_d8.super_QStyleOption.rect.x1.m_i = iVar5;
  }
  local_d8.super_QStyleOption.rect.y2.m_i = local_d8.super_QStyleOption.rect.y2.m_i + iVar11;
  local_d8.super_QStyleOption.rect.x2.m_i = local_d8.super_QStyleOption.rect.x2.m_i + iVar9;
  (**(code **)(*(long *)local_118 + 0xb8))(local_118,7,&local_d8,&local_128,pQStack_120);
  QPainter::end();
  pQVar6 = this->movingTab;
  QPixmap::operator=(&pQVar6->m_pixmap,(QPixmap *)local_108);
  QWidget::update(&pQVar6->super_QWidget);
  r = (QRect *)local_e8;
  QWidget::setGeometry(&this->movingTab->super_QWidget,r);
  iVar5 = (int)r;
  QWidget::raise(&this->movingTab->super_QWidget,iVar5);
  pTVar2 = (this->tabList).d.ptr[this->pressedIndex];
  pQVar1 = pTVar2->leftWidget;
  if (pQVar1 != (QWidget *)0x0) {
    QWidget::raise(pQVar1,iVar5);
  }
  pQVar1 = pTVar2->rightWidget;
  if (pQVar1 != (QWidget *)0x0) {
    QWidget::raise(pQVar1,iVar5);
  }
  if ((QWidget *)this->leftB != (QWidget *)0x0) {
    QWidget::raise((QWidget *)this->leftB,iVar5);
  }
  if ((QWidget *)this->rightB != (QWidget *)0x0) {
    QWidget::raise((QWidget *)this->rightB,iVar5);
  }
  (**(code **)(*(long *)&this->movingTab->super_QWidget + 0x68))(this->movingTab,1);
  QIcon::~QIcon(&local_d8.icon);
  if (&(local_d8.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.text.d.d)->super_QArrayData,2,0x10);
    }
  }
  QStyleOption::~QStyleOption(&local_d8.super_QStyleOption);
  QPainter::~QPainter((QPainter *)&local_128);
  QPixmap::~QPixmap((QPixmap *)local_108);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTabBarPrivate::setupMovableTab()
{
    Q_Q(QTabBar);
    if (!movingTab)
        movingTab = new QMovableTabWidget(q);

    int taboverlap = q->style()->pixelMetric(QStyle::PM_TabBarTabOverlap, nullptr ,q);
    QRect grabRect = q->tabRect(pressedIndex);
    if (verticalTabs(shape))
        grabRect.adjust(0, -taboverlap, 0, taboverlap);
    else
        grabRect.adjust(-taboverlap, 0, taboverlap, 0);

    QPixmap grabImage(grabRect.size() * q->devicePixelRatio());
    grabImage.setDevicePixelRatio(q->devicePixelRatio());
    grabImage.fill(Qt::transparent);
    QStylePainter p(&grabImage, q);

    QStyleOptionTab tab;
    q->initStyleOption(&tab, pressedIndex);
    tab.position = QStyleOptionTab::Moving;
    if (verticalTabs(shape))
        tab.rect.moveTopLeft(QPoint(0, taboverlap));
    else
        tab.rect.moveTopLeft(QPoint(taboverlap, 0));
    p.drawControl(QStyle::CE_TabBarTab, tab);
    p.end();

    movingTab->setPixmap(grabImage);
    movingTab->setGeometry(grabRect);
    movingTab->raise();

    // Re-arrange widget order to avoid overlaps
    const auto &pressedTab = *tabList.at(pressedIndex);
    if (pressedTab.leftWidget)
        pressedTab.leftWidget->raise();
    if (pressedTab.rightWidget)
        pressedTab.rightWidget->raise();
    if (leftB)
        leftB->raise();
    if (rightB)
        rightB->raise();
    movingTab->setVisible(true);
}